

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O0

void Cfffiou(int unit,int *status)

{
  int local_1c;
  int i;
  int *status_local;
  int unit_local;
  
  if (*status < 1) {
    if (unit == -1) {
      local_1c = 0x32;
      while (local_1c < 10000) {
        gFitsFiles[local_1c] = (fitsfile *)0x0;
        local_1c = local_1c + 1;
      }
    }
    else if ((unit < 1) || (9999 < unit)) {
      *status = 0x72;
      ffpmsg("Cfffiou was sent an unacceptable unit number.");
    }
    else {
      gFitsFiles[unit] = (fitsfile *)0x0;
    }
  }
  return;
}

Assistant:

void Cfffiou( int unit, int *status )
{
   if( *status>0 ) return;
   FFLOCK;
   if( unit == -1 ) {
      int i; for( i=50; i<NMAXFILES; ) gFitsFiles[i++]=NULL;
   } else if( unit<1 || unit>=NMAXFILES ) {
      *status = BAD_FILEPTR;
      ffpmsg("Cfffiou was sent an unacceptable unit number.");
   } else gFitsFiles[unit]=NULL;
   FFUNLOCK;
}